

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O3

int touch(tgestate_t *state,vischar_t *vischar,spriteindex_t sprite_index)

{
  undefined4 uVar1;
  int iVar2;
  
  vischar->counter_and_flags = vischar->counter_and_flags | 0xc0;
  if ((state->vischars == vischar) && (state->automatic_player_counter != '\0')) {
    door_handling(state,vischar);
  }
  if (((state->vischars < vischar) || ((state->vischars[0].flags & 3) != 2)) &&
     (iVar2 = bounds_check(state,vischar), iVar2 != 0)) {
    return 1;
  }
  if ((vischar->character < 0x1a) && (iVar2 = collision(state), iVar2 != 0)) {
    return 1;
  }
  vischar->counter_and_flags = vischar->counter_and_flags & 0xbf;
  uVar1 = *(undefined4 *)&state->saved_mappos;
  (vischar->mi).mappos.u = (short)uVar1;
  (vischar->mi).mappos.v = (short)((uint)uVar1 >> 0x10);
  (vischar->mi).mappos.w = (state->saved_mappos).pos16.w;
  (vischar->mi).sprite_index = sprite_index;
  return 0;
}

Assistant:

int touch(tgestate_t *state, vischar_t *vischar, spriteindex_t sprite_index)
{
  /* Conv: Removed $81AA stashed sprite index. */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  assert((sprite_index & ~sprite_FLAG_FLIP) < sprite__LIMIT);

  vischar->counter_and_flags |= vischar_BYTE7_DONT_MOVE_MAP | vischar_DRAWABLE;

  /* Conv: Removed little register shuffle to get (vischar & 0xFF) into A. */

  /* If hero is player controlled then check for door transitions. */
  if (vischar == &state->vischars[0] && state->automatic_player_counter > 0)
    door_handling(state, vischar);

  /* If a non-player character or hero when he's not cutting the fence. */
  if (vischar > &state->vischars[0] || ((state->vischars[0].flags & (vischar_FLAGS_PICKING_LOCK | vischar_FLAGS_CUTTING_WIRE)) != vischar_FLAGS_CUTTING_WIRE))
    if (bounds_check(state, vischar))
      return 1; /* Outwith wall bounds. */

  /* Check "real" characters for collisions. */
  if (vischar->character <= character_25_PRISONER_6) /* character temp was in A' */
    if (collision(state))
      // there was a collision
      return 1;

  /* At this point we handle non-colliding characters and items only. */

  vischar->counter_and_flags &= ~vischar_BYTE7_DONT_MOVE_MAP; // clear
  vischar->mi.mappos          = state->saved_mappos.pos16;
  vischar->mi.sprite_index    = sprite_index; // left/right flip flag / sprite offset

  // A = 0; likely just to set flags
  return 0; // Z
}